

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void * alloc_small(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  long lVar1;
  size_t sVar2;
  j_common_ptr cinfo_00;
  size_t sVar3;
  ulong in_RDX;
  int in_ESI;
  long *in_RDI;
  size_t slop;
  size_t min_request;
  char *data_ptr;
  small_pool_ptr_conflict prev_hdr_ptr;
  small_pool_ptr_conflict hdr_ptr;
  my_mem_ptr mem;
  undefined8 in_stack_ffffffffffffffb8;
  int which;
  ulong sizeofobject_00;
  j_common_ptr in_stack_ffffffffffffffc0;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  
  which = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = in_RDI[1];
  if (1000000000 < in_RDX) {
    out_of_memory(in_stack_ffffffffffffffc0,which);
  }
  sVar2 = round_up_pow2(in_RDX,0x20);
  if (1000000000 < sVar2 + 0x37) {
    out_of_memory(in_stack_ffffffffffffffc0,which);
  }
  if ((in_ESI < 0) || (1 < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xe;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_30 = (undefined8 *)0x0;
  for (local_28 = *(undefined8 **)(lVar1 + 0x68 + (long)in_ESI * 8);
      (local_28 != (undefined8 *)0x0 && ((ulong)local_28[2] < sVar2));
      local_28 = (undefined8 *)*local_28) {
    local_30 = local_28;
  }
  if (local_28 == (undefined8 *)0x0) {
    cinfo_00 = (j_common_ptr)(sVar2 + 0x37);
    if (local_30 == (undefined8 *)0x0) {
      sVar3 = first_pool_slop[in_ESI];
    }
    else {
      sVar3 = extra_pool_slop[in_ESI];
    }
    if (1000000000U - (long)cinfo_00 < sVar3) {
      sVar3 = 1000000000 - (long)cinfo_00;
    }
    while (sizeofobject_00 = sVar3,
          local_28 = (undefined8 *)jpeg_get_small(cinfo_00,sizeofobject_00),
          local_28 == (undefined8 *)0x0) {
      sVar3 = sizeofobject_00 >> 1;
      if (sVar3 < 0x32) {
        out_of_memory(cinfo_00,(uint)(sizeofobject_00 >> 0x21));
      }
    }
    *(ulong *)(lVar1 + 0x98) = (long)&cinfo_00->err + *(long *)(lVar1 + 0x98) + sizeofobject_00;
    *local_28 = 0;
    local_28[1] = 0;
    local_28[2] = sVar2 + sizeofobject_00;
    if (local_30 == (undefined8 *)0x0) {
      *(undefined8 **)(lVar1 + 0x68 + (long)in_ESI * 8) = local_28;
    }
    else {
      *local_30 = local_28;
    }
  }
  local_38 = local_28 + 3;
  if (((ulong)local_38 & 0x1f) != 0) {
    local_38 = (undefined8 *)((0x20 - ((ulong)local_38 & 0x1f)) + (long)local_38);
  }
  lVar1 = local_28[1];
  local_28[1] = sVar2 + local_28[1];
  local_28[2] = local_28[2] - sVar2;
  return (void *)(lVar1 + (long)local_38);
}

Assistant:

METHODDEF(void *)
alloc_small(j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "small" object */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  small_pool_ptr hdr_ptr, prev_hdr_ptr;
  char *data_ptr;
  size_t min_request, slop;

  /*
   * Round up the requested size to a multiple of ALIGN_SIZE in order
   * to assure alignment for the next object allocated in the same pool
   * and so that algorithms can straddle outside the proper area up
   * to the next alignment.
   */
  if (sizeofobject > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 7);
  }
  sizeofobject = round_up_pow2(sizeofobject, ALIGN_SIZE);

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if ((sizeof(small_pool_hdr) + sizeofobject + ALIGN_SIZE - 1) >
      MAX_ALLOC_CHUNK)
    out_of_memory(cinfo, 1);    /* request exceeds malloc's ability */

  /* See if space is available in any existing pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id); /* safety check */
  prev_hdr_ptr = NULL;
  hdr_ptr = mem->small_list[pool_id];
  while (hdr_ptr != NULL) {
    if (hdr_ptr->bytes_left >= sizeofobject)
      break;                    /* found pool with enough space */
    prev_hdr_ptr = hdr_ptr;
    hdr_ptr = hdr_ptr->next;
  }

  /* Time to make a new pool? */
  if (hdr_ptr == NULL) {
    /* min_request is what we need now, slop is what will be leftover */
    min_request = sizeof(small_pool_hdr) + sizeofobject + ALIGN_SIZE - 1;
    if (prev_hdr_ptr == NULL)   /* first pool in class? */
      slop = first_pool_slop[pool_id];
    else
      slop = extra_pool_slop[pool_id];
    /* Don't ask for more than MAX_ALLOC_CHUNK */
    if (slop > (size_t)(MAX_ALLOC_CHUNK - min_request))
      slop = (size_t)(MAX_ALLOC_CHUNK - min_request);
    /* Try to get space, if fail reduce slop and try again */
    for (;;) {
      hdr_ptr = (small_pool_ptr)jpeg_get_small(cinfo, min_request + slop);
      if (hdr_ptr != NULL)
        break;
      slop /= 2;
      if (slop < MIN_SLOP)      /* give up when it gets real small */
        out_of_memory(cinfo, 2); /* jpeg_get_small failed */
    }
    mem->total_space_allocated += min_request + slop;
    /* Success, initialize the new pool header and add to end of list */
    hdr_ptr->next = NULL;
    hdr_ptr->bytes_used = 0;
    hdr_ptr->bytes_left = sizeofobject + slop;
    if (prev_hdr_ptr == NULL)   /* first pool in class? */
      mem->small_list[pool_id] = hdr_ptr;
    else
      prev_hdr_ptr->next = hdr_ptr;
  }

  /* OK, allocate the object from the current pool */
  data_ptr = (char *)hdr_ptr; /* point to first data byte in pool... */
  data_ptr += sizeof(small_pool_hdr); /* ...by skipping the header... */
  if ((size_t)data_ptr % ALIGN_SIZE) /* ...and adjust for alignment */
    data_ptr += ALIGN_SIZE - (size_t)data_ptr % ALIGN_SIZE;
  data_ptr += hdr_ptr->bytes_used; /* point to place for object */
  hdr_ptr->bytes_used += sizeofobject;
  hdr_ptr->bytes_left -= sizeofobject;

  return (void *)data_ptr;
}